

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_map.cpp
# Opt level: O2

void __thiscall
CorruptInternalNodes_ChildClaimsToBeOnHeap_Test::~CorruptInternalNodes_ChildClaimsToBeOnHeap_Test
          (CorruptInternalNodes_ChildClaimsToBeOnHeap_Test *this)

{
  anon_unknown.dwarf_13be9a::CorruptInternalNodes::~CorruptInternalNodes
            (&this->super_CorruptInternalNodes);
  operator_delete(this,0x160);
  return;
}

Assistant:

TEST_F (CorruptInternalNodes, ChildClaimsToBeOnHeap) {
    {
        transaction_type t1 = begin (db_, lock_guard{mutex_});
        this->build (t1);

        index_pointer root = index_->root ();
        this->check_is_store_internal_node (root);

        // Corrupt the first child field such it claims to be on the heap.
        {
            std::shared_ptr<internal_node> inode = this->load_inode (root);
            index_pointer & first = (*inode)[0];
            first =
                index_pointer{reinterpret_cast<internal_node *> (first.to_address ().absolute ())};
        }
        t1.commit ();
    }
    this->iterate ();
    this->find ();
}